

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void binder<main::__6>(type *func)

{
  int local_24;
  undefined1 local_20 [4];
  int i;
  type f;
  type *func_local;
  
  f._8_8_ = func;
  std::bind<void(&)(unsigned_long,main::__6&),std::_Placeholder<1>const&,main::__6>
            ((type *)local_20,caller2<main::__6>,(_Placeholder<1> *)&std::placeholders::_1,func);
  local_24 = 0;
  std::_Bind<void(*(std::_Placeholder<1>,main::$_6))(unsigned_long,main::$_6&)>::operator()
            ((_Bind<void(*(std::_Placeholder<1>,main::__6))(unsigned_long,main::__6&)> *)local_20,
             &local_24);
  return;
}

Assistant:

static inline void
binder(Func &&func, Args&&... args)
{
    auto f = std::bind(caller2<typename std::decay<Func>::type,
                       typename std::decay<Args>::type...>,
                       std::placeholders::_1,
                       std::forward<Func>(func),
                       std::forward<Args>(args)...);
    int i = 0;
    f(i);
}